

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_opt_goal(REF_DBL *metric,REF_GRID ref_grid,REF_INT nequations,REF_DBL *solution,
                   REF_RECON_RECONSTRUCTION reconstruction,REF_INT p_norm,REF_DBL gradation,
                   REF_DBL target_complexity)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_DBL *scalar;
  REF_DBL *grad;
  REF_DBL *scalar_00;
  REF_DBL *hessian;
  int iVar3;
  double local_b8;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_DBL *hess_flux;
  REF_DBL *flux;
  REF_DBL *grad_lam;
  REF_DBL *lam;
  int local_60;
  REF_INT dir;
  REF_INT var;
  REF_INT ldim;
  REF_INT node;
  REF_INT i;
  REF_NODE ref_node;
  REF_DBL target_complexity_local;
  REF_DBL gradation_local;
  REF_INT p_norm_local;
  REF_RECON_RECONSTRUCTION reconstruction_local;
  REF_DBL *solution_local;
  REF_INT nequations_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  pRVar1 = ref_grid->node;
  for (var = 0; var < pRVar1->max; var = var + 1) {
    if (((-1 < var) && (var < pRVar1->max)) && (-1 < pRVar1->global[var])) {
      for (ldim = 0; ldim < 6; ldim = ldim + 1) {
        metric[ldim + var * 6] = 0.0;
      }
    }
  }
  local_60 = 0;
  while( true ) {
    if (nequations <= local_60) {
      if (ref_grid->twod != 0) {
        for (var = 0; var < pRVar1->max; var = var + 1) {
          if (((-1 < var) && (var < pRVar1->max)) && (-1 < pRVar1->global[var])) {
            metric[var * 6 + 2] = 0.0;
            metric[var * 6 + 4] = 0.0;
            metric[var * 6 + 5] = 1.0;
          }
        }
      }
      metric_local._4_4_ = ref_recon_roundoff_limit(metric,ref_grid);
      if (metric_local._4_4_ == 0) {
        metric_local._4_4_ = ref_metric_local_scale(metric,ref_grid,p_norm);
        if (metric_local._4_4_ == 0) {
          metric_local._4_4_ =
               ref_metric_gradation_at_complexity(metric,ref_grid,gradation,target_complexity);
          if (metric_local._4_4_ == 0) {
            metric_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xa7a,"ref_metric_opt_goal",(ulong)metric_local._4_4_,"gradation at complexity")
            ;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa76,"ref_metric_opt_goal",(ulong)metric_local._4_4_,"local scale lp norm");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa74,"ref_metric_opt_goal",(ulong)metric_local._4_4_,
               "floor metric eigenvalues based on grid size and solution jitter");
      }
      return metric_local._4_4_;
    }
    if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa51,"ref_metric_opt_goal","malloc lam of REF_DBL negative");
      return 1;
    }
    scalar = (REF_DBL *)malloc((long)pRVar1->max << 3);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa51,"ref_metric_opt_goal","malloc lam of REF_DBL NULL");
      return 2;
    }
    for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < pRVar1->max;
        ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
      scalar[ref_malloc_init_i_2] = 0.0;
    }
    if (pRVar1->max * 3 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa52,"ref_metric_opt_goal","malloc grad_lam of REF_DBL negative");
      return 1;
    }
    grad = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
    if (grad == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa52,"ref_metric_opt_goal","malloc grad_lam of REF_DBL NULL");
      return 2;
    }
    for (ref_malloc_init_i_3 = 0;
        SBORROW4(ref_malloc_init_i_3,pRVar1->max * 3) != ref_malloc_init_i_3 + pRVar1->max * -3 < 0;
        ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
      grad[ref_malloc_init_i_3] = 0.0;
    }
    if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa53,"ref_metric_opt_goal","malloc flux of REF_DBL negative");
      return 1;
    }
    scalar_00 = (REF_DBL *)malloc((long)pRVar1->max << 3);
    if (scalar_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa53,"ref_metric_opt_goal","malloc flux of REF_DBL NULL");
      return 2;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRVar1->max;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      scalar_00[ref_private_macro_code_rss] = 0.0;
    }
    if (pRVar1->max * 6 < 0) break;
    hessian = (REF_DBL *)malloc((long)(pRVar1->max * 6) << 3);
    if (hessian == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa54,"ref_metric_opt_goal","malloc hess_flux of REF_DBL NULL");
      return 2;
    }
    for (ref_private_macro_code_rss_1 = 0;
        SBORROW4(ref_private_macro_code_rss_1,pRVar1->max * 6) !=
        ref_private_macro_code_rss_1 + pRVar1->max * -6 < 0;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      hessian[ref_private_macro_code_rss_1] = 0.0;
    }
    for (var = 0; var < pRVar1->max; var = var + 1) {
      if (((-1 < var) && (var < pRVar1->max)) && (-1 < pRVar1->global[var])) {
        scalar[var] = solution[local_60 + nequations * 4 * var];
      }
    }
    uVar2 = ref_recon_gradient(ref_grid,scalar,grad,reconstruction);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa59,"ref_metric_opt_goal",(ulong)uVar2,"grad_lam");
      return uVar2;
    }
    for (lam._4_4_ = 0; lam._4_4_ < 3; lam._4_4_ = lam._4_4_ + 1) {
      for (var = 0; var < pRVar1->max; var = var + 1) {
        if (((-1 < var) && (var < pRVar1->max)) && (-1 < pRVar1->global[var])) {
          scalar_00[var] = solution[local_60 + nequations * (lam._4_4_ + 1) + nequations * 4 * var];
        }
      }
      uVar2 = ref_recon_hessian(ref_grid,scalar_00,hessian,reconstruction);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa5f,"ref_metric_opt_goal",(ulong)uVar2,"hess");
        return uVar2;
      }
      for (var = 0; var < pRVar1->max; var = var + 1) {
        if (((-1 < var) && (var < pRVar1->max)) && (-1 < pRVar1->global[var])) {
          for (ldim = 0; ldim < 6; ldim = ldim + 1) {
            if (grad[lam._4_4_ + var * 3] <= 0.0) {
              local_b8 = -grad[lam._4_4_ + var * 3];
            }
            else {
              local_b8 = grad[lam._4_4_ + var * 3];
            }
            iVar3 = ldim + var * 6;
            metric[iVar3] = local_b8 * hessian[ldim + var * 6] + metric[iVar3];
          }
        }
      }
    }
    if (hessian != (REF_DBL *)0x0) {
      free(hessian);
    }
    if (scalar_00 != (REF_DBL *)0x0) {
      free(scalar_00);
    }
    if (grad != (REF_DBL *)0x0) {
      free(grad);
    }
    if (scalar != (REF_DBL *)0x0) {
      free(scalar);
    }
    local_60 = local_60 + 1;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xa54,
         "ref_metric_opt_goal","malloc hess_flux of REF_DBL negative");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_opt_goal(REF_DBL *metric, REF_GRID ref_grid,
                                       REF_INT nequations, REF_DBL *solution,
                                       REF_RECON_RECONSTRUCTION reconstruction,
                                       REF_INT p_norm, REF_DBL gradation,
                                       REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_INT ldim;
  REF_INT var, dir;

  ldim = 4 * nequations;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) metric[i + 6 * node] = 0.0;
  }

  for (var = 0; var < nequations; var++) {
    REF_DBL *lam, *grad_lam, *flux, *hess_flux;
    ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(flux, ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(hess_flux, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = solution[var + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");

    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        flux[node] = solution[var + nequations * (1 + dir) + ldim * node];
      }
      RSS(ref_recon_hessian(ref_grid, flux, hess_flux, reconstruction), "hess");
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 6; i++)
          metric[i + 6 * node] +=
              ABS(grad_lam[dir + 3 * node]) * hess_flux[i + 6 * node];
      }
    }
    ref_free(hess_flux);
    ref_free(flux);
    ref_free(grad_lam);
    ref_free(lam);
  }
  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");

  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");

  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         target_complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}